

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O2

string * __thiscall
sc_core::vcd_trace::compose_line(string *__return_storage_ptr__,vcd_trace *this,string *data)

{
  char *__rhs;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->bit_width == 1) {
    std::operator+(__return_storage_ptr__,data,&this->vcd_name);
  }
  else if (this->bit_width == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_80);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,"b",&local_81);
    __rhs = strip_leading_bits((data->_M_dataplus)._M_p);
    std::operator+(&local_60,&local_40,__rhs);
    std::operator+(&local_80,&local_60," ");
    std::operator+(__return_storage_ptr__,&local_80,&this->vcd_name);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
vcd_trace::compose_line(const std::string& data)
{
  if(bit_width == 0)
    return "";
  if(bit_width == 1)
    return data + vcd_name;
  return std::string("b")+strip_leading_bits(data.c_str())+" "+vcd_name;
}